

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

void des_key_setup(uint64_t key,des_keysched *sched)

{
  ulong uVar1;
  uint32_t uVar2;
  long lVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  lVar3 = 0;
  uVar1 = 0;
  do {
    uVar5 = 0;
    if (-1 < des_key_setup::PC1[lVar3]) {
      uVar5 = (ulong)((key >> ((ulong)(byte)des_key_setup::PC1[lVar3] & 0x3f) & 1) != 0);
    }
    uVar1 = uVar5 + uVar1 * 2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x3c);
  lVar3 = 0;
  do {
    uVar1 = uVar1 << (*(byte *)(des_key_setup::leftshifts + lVar3) & 0x3f);
    uVar1 = uVar1 >> 0x1c & 0xf0000000f | uVar1 & 0xfffffff0fffffff;
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar6 = 0;
      if (-1 < des_key_setup::PC2_7531[lVar4]) {
        uVar6 = (uint)((uVar1 >> ((ulong)(byte)des_key_setup::PC2_7531[lVar4] & 0x3f) & 1) != 0);
      }
      uVar2 = uVar6 + uVar2 * 2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    sched->k7531[lVar3] = uVar2;
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar6 = 0;
      if (-1 < des_key_setup::PC2_6420[lVar4]) {
        uVar6 = (uint)((uVar1 >> ((ulong)(byte)des_key_setup::PC2_6420[lVar4] & 0x3f) & 1) != 0);
      }
      uVar2 = uVar6 + uVar2 * 2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    sched->k6420[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

static void des_key_setup(uint64_t key, des_keysched *sched)
{
    static const int8_t PC1[] = {
         7, 15, 23, 31, 39, 47, 55, 63,  6, 14, 22, 30, 38, 46,
        54, 62,  5, 13, 21, 29, 37, 45, 53, 61,  4, 12, 20, 28,
        -1, -1, -1, -1,
         1,  9, 17, 25, 33, 41, 49, 57,  2, 10, 18, 26, 34, 42,
        50, 58,  3, 11, 19, 27, 35, 43, 51, 59, 36, 44, 52, 60,
    };
    static const int8_t PC2_7531[] = {
        46, 43, 49, 36, 59, 55, -1, -1, /* index into S-box 7 */
        37, 41, 48, 56, 34, 52, -1, -1, /* index into S-box 5 */
        15,  4, 25, 19,  9,  1, -1, -1, /* index into S-box 3 */
        12,  7, 17,  0, 22,  3, -1, -1, /* index into S-box 1 */
    };
    static const int8_t PC2_6420[] = {
        57, 32, 45, 54, 39, 50, -1, -1, /* index into S-box 6 */
        44, 53, 33, 40, 47, 58, -1, -1, /* index into S-box 4 */
        26, 16,  5, 11, 23,  8, -1, -1, /* index into S-box 2 */
        10, 14,  6, 20, 27, 24, -1, -1, /* index into S-box 0 */
    };
    static const int leftshifts[] = {1,1,2,2,2,2,2,2,1,2,2,2,2,2,2,1};

    /* Select 56 bits from the 64-bit input key integer (the low bit
     * of each input byte is unused), into a word consisting of two
     * 28-bit integers starting at bits 0 and 32. */
    uint64_t CD = bitsel(key, PC1, lenof(PC1));

    for (size_t i = 0; i < 16; i++) {
        /* Rotate each 28-bit half of CD left by 1 or 2 bits (varying
         * between rounds) */
        CD <<= leftshifts[i];
        CD = (CD & 0x0FFFFFFF0FFFFFFF) | ((CD & 0xF0000000F0000000) >> 28);

        /* Select key bits from the rotated word to use during the
         * actual cipher */
        sched->k7531[i] = bitsel(CD, PC2_7531, lenof(PC2_7531));
        sched->k6420[i] = bitsel(CD, PC2_6420, lenof(PC2_6420));
    }
}